

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IcePoint.cpp
# Opt level: O1

Point * __thiscall
IceMaths::Point::Refract(Point *this,Point *eye,Point *n,float refractindex,Point *refracted)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar6 = eye->x - this->x;
  fVar4 = eye->y - this->y;
  fVar5 = eye->z - this->z;
  fVar1 = n->x;
  fVar2 = n->y;
  fVar3 = n->z;
  fVar7 = (fVar3 * fVar5 + fVar1 * fVar6 + fVar4 * fVar2) / refractindex;
  fVar8 = fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2;
  refracted->x = fVar1 * fVar7 - fVar6 * fVar8;
  refracted->y = fVar2 * fVar7 - fVar4 * fVar8;
  refracted->z = fVar7 * fVar3 - fVar8 * fVar5;
  return this;
}

Assistant:

Point& Point::Refract(const Point& eye, const Point& n, float refractindex, Point& refracted)
{
	//	Point EyePt = eye position
	//	Point p = current vertex
	//	Point n = vertex normal
	//	Point rv = refracted vector
	//	Eye vector - doesn't need to be normalized
	Point Env;
	Env.x = eye.x - x;
	Env.y = eye.y - y;
	Env.z = eye.z - z;

	float NDotE = n|Env;
	float NDotN = n|n;
	NDotE /= refractindex;

	// Refracted vector
	refracted = n*NDotE - Env*NDotN;

	return *this;
}